

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O1

bool LTACMasterdataChannel::PassOnRequest(LTACMasterdataChannel *pChn,acStatUpdateTy *requ)

{
  _List_node_base *p_Var1;
  char cVar2;
  int iVar3;
  _List_node_base *p_Var4;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&mtxMaster);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  p_Var4 = lstChn_abi_cxx11_.
           super__List_base<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (pChn != (LTACMasterdataChannel *)0x0) {
    for (; (p_Var4 != (_List_node_base *)&lstChn_abi_cxx11_ &&
           ((LTACMasterdataChannel *)p_Var4[1]._M_next != pChn)); p_Var4 = p_Var4->_M_next) {
    }
    if (p_Var4 != (_List_node_base *)&lstChn_abi_cxx11_) {
      p_Var4 = p_Var4->_M_next;
    }
  }
  while( true ) {
    if (p_Var4 == (_List_node_base *)&lstChn_abi_cxx11_) {
      pthread_mutex_unlock((pthread_mutex_t *)&mtxMaster);
      return false;
    }
    p_Var1 = p_Var4[1]._M_next;
    cVar2 = (*(code *)p_Var1->_M_next[5]._M_next)(p_Var1);
    if ((cVar2 != '\0') &&
       (cVar2 = (*(code *)p_Var1->_M_next[0xb]._M_next)(p_Var1,requ), cVar2 != '\0')) break;
    p_Var4 = (((_List_base<LTACMasterdataChannel_*,_std::allocator<LTACMasterdataChannel_*>_> *)
              &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&mtxMaster);
  if (p_Var4 == (_List_node_base *)&lstChn_abi_cxx11_) {
    return false;
  }
  return true;
}

Assistant:

bool LTACMasterdataChannel::PassOnRequest (LTACMasterdataChannel* pChn, const acStatUpdateTy& requ)
{
    try {
        std::lock_guard<std::recursive_mutex> lock (mtxMaster);
        auto iter = lstChn.begin();
        if (pChn) {                                 // if channel passed in find _next_ channel
            iter = std::find(lstChn.begin(), lstChn.end(), pChn);
            if (iter != lstChn.end()) ++iter;
        }
        // Loop to find a channel, which accepts
        for (;iter != lstChn.end(); ++iter) {
            LTACMasterdataChannel& ch = *(*iter);
            if (ch.IsEnabled() &&
                ch.AcceptRequest(requ))
                return true;
        }

    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, "mtxMaster", e.what());
    }
    return false;
}